

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

ggml_tensor * __thiscall
llama_model_loader::require_tensor_meta(llama_model_loader *this,string *name)

{
  runtime_error *this_00;
  undefined8 uVar1;
  char *in_RDI;
  ggml_tensor *tensor;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  string local_38 [32];
  ggml_tensor *local_18;
  
  std::__cxx11::string::c_str();
  local_18 = get_tensor_meta((llama_model_loader *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RDI);
  if (local_18 == (ggml_tensor *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    uVar1 = std::__cxx11::string::c_str();
    format_abi_cxx11_((char *)local_38,"%s: tensor \'%s\' not found","require_tensor_meta",uVar1);
    std::runtime_error::runtime_error(this_00,local_38);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_18;
}

Assistant:

struct ggml_tensor * llama_model_loader::require_tensor_meta(const std::string & name) const {
    struct ggml_tensor * tensor = get_tensor_meta(name.c_str());
    if (!tensor) {
        throw std::runtime_error(format("%s: tensor '%s' not found", __func__, name.c_str()));
    }
    return tensor;
}